

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O1

void yy_pop_parser_stack(yyParser_conflict *pParser)

{
  yyStackEntry_conflict *pyVar1;
  
  pyVar1 = pParser->yytos;
  if (pyVar1 == (yyStackEntry_conflict *)0x0) {
    __assert_fail("pParser->yytos!=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/zcc-parse.c"
                  ,0x702,"void yy_pop_parser_stack(yyParser *)");
  }
  if (pParser->yystack < pyVar1) {
    pParser->yytos = pyVar1 + -1;
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sPopping %s\n",yyTracePrompt,yyTokenName[pyVar1->major]);
      fflush((FILE *)yyTraceFILE);
      return;
    }
    return;
  }
  __assert_fail("pParser->yytos > pParser->yystack",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/zcc-parse.c"
                ,0x703,"void yy_pop_parser_stack(yyParser *)");
}

Assistant:

static void yy_pop_parser_stack(yyParser *pParser){
  yyStackEntry *yytos;
  assert( pParser->yytos!=0 );
  assert( pParser->yytos > pParser->yystack );
  yytos = pParser->yytos--;
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sPopping %s\n",
      yyTracePrompt,
      yyTokenName[yytos->major]);
    fflush(yyTraceFILE);
  }
#endif
  yy_destructor(pParser, yytos->major, &yytos->minor);
}